

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

qpTestLog * qpTestLog_createFileLog(char *fileName,deUint32 flags)

{
  deUint32 dVar1;
  qpTestLog *log;
  FILE *pFVar2;
  qpXmlWriter *pqVar3;
  deMutex dVar4;
  char *pcVar5;
  
  log = (qpTestLog *)deCalloc(0x28);
  if (log == (qpTestLog *)0x0) {
    return (qpTestLog *)0x0;
  }
  qpPrintf("Writing test log into %s\n",fileName);
  pFVar2 = fopen(fileName,"wb");
  log->outputFile = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    pcVar5 = "ERROR: Unable to open test log output file \'%s\'.\n";
  }
  else {
    log->flags = flags;
    pqVar3 = qpXmlWriter_createFileWriter((FILE *)pFVar2,0,(uint)((flags & 4) == 0));
    log->writer = pqVar3;
    dVar4 = deMutex_create((deMutexAttributes *)0x0);
    log->lock = dVar4;
    log->isSessionOpen = 0;
    log->isCaseOpen = 0;
    if (log->writer != (qpXmlWriter *)0x0) {
      if (dVar4 != 0) {
        pFVar2 = (FILE *)log->outputFile;
        pcVar5 = qpGetReleaseName();
        fprintf(pFVar2,"#sessionInfo releaseName %s\n",pcVar5);
        pFVar2 = (FILE *)log->outputFile;
        dVar1 = qpGetReleaseId();
        fprintf(pFVar2,"#sessionInfo releaseId 0x%08x\n",(ulong)dVar1);
        pFVar2 = (FILE *)log->outputFile;
        pcVar5 = qpGetTargetName();
        fprintf(pFVar2,"#sessionInfo targetName \"%s\"\n",pcVar5);
        fwrite("#beginSession\n",0xe,1,(FILE *)log->outputFile);
        fflush((FILE *)log->outputFile);
        log->isSessionOpen = 1;
        return log;
      }
      qpPrintf("ERROR: Unable to create mutex.\n");
      goto LAB_00935c68;
    }
    pcVar5 = "ERROR: Unable to create output XML writer to file \'%s\'.\n";
  }
  qpPrintf(pcVar5,fileName);
LAB_00935c68:
  qpTestLog_destroy(log);
  return (qpTestLog *)0x0;
}

Assistant:

qpTestLog* qpTestLog_createFileLog (const char* fileName, deUint32 flags)
{
	qpTestLog* log = (qpTestLog*)deCalloc(sizeof(qpTestLog));
	if (!log)
		return DE_NULL;

	DE_ASSERT(fileName && fileName[0]); /* must have filename. */

#if defined(DE_DEBUG)
	ContainerStack_reset(&log->containerStack);
#endif

	qpPrintf("Writing test log into %s\n", fileName);

	/* Create output file. */
	log->outputFile = fopen(fileName, "wb");
	if (!log->outputFile)
	{
		qpPrintf("ERROR: Unable to open test log output file '%s'.\n", fileName);
		qpTestLog_destroy(log);
		return DE_NULL;
	}

	log->flags			= flags;
	log->writer			= qpXmlWriter_createFileWriter(log->outputFile, 0, !(flags & QP_TEST_LOG_NO_FLUSH));
	log->lock			= deMutex_create(DE_NULL);
	log->isSessionOpen	= DE_FALSE;
	log->isCaseOpen		= DE_FALSE;

	if (!log->writer)
	{
		qpPrintf("ERROR: Unable to create output XML writer to file '%s'.\n", fileName);
		qpTestLog_destroy(log);
		return DE_NULL;
	}

	if (!log->lock)
	{
		qpPrintf("ERROR: Unable to create mutex.\n");
		qpTestLog_destroy(log);
		return DE_NULL;
	}

	beginSession(log);

	return log;
}